

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O2

void vector_suite::test_bool_one(void)

{
  value_type input [4];
  vector<bool,_std::allocator<bool>_> value;
  iarchive in;
  undefined4 local_e8;
  uchar local_e4 [4];
  _Bvector_base<std::allocator<bool>_> local_e0;
  reference local_b8;
  iarchive local_a8;
  
  local_b8._M_mask = (_Bit_type)local_b8._M_p;
  local_e4[0] = 0x92;
  local_e4[1] = '\x01';
  local_e4[2] = 0x81;
  local_e4[3] = 0x93;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[4]>(&local_a8,&local_e4);
  local_e0._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_e0._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_e0._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_e0._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_e0._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  trial::protocol::bintoken::iarchive::load_override<std::vector<bool,std::allocator<bool>>>
            (&local_a8,(vector<bool,_std::allocator<bool>_> *)&local_e0);
  local_b8._M_p =
       (_Bit_type *)
       ((ulong)local_e0._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
               _M_offset +
       ((long)local_e0._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
       (long)local_e0._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8);
  local_e8 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,400,"void vector_suite::test_bool_one()",&local_b8,&local_e8);
  local_b8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)&local_e0,0);
  local_e8 = CONCAT31(local_e8._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::_Bit_reference,bool>
            ("value[0]","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x191,"void vector_suite::test_bool_one()",&local_b8,&local_e8);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_e0);
  trial::protocol::bintoken::iarchive::~iarchive(&local_a8);
  return;
}

Assistant:

void test_bool_one()
{
    const value_type input[] = { token::code::begin_array,
                                 0x01,
                                 token::code::true_value,
                                 token::code::end_array };
    format::iarchive in(input);
    std::vector<bool> value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], true);
}